

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

void __thiscall MetaCommand::ListOptionsXML(MetaCommand *this)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  ostream *poVar4;
  MetaCommand *this_00;
  reference pOVar5;
  size_type sVar6;
  reference pFVar7;
  const_iterator itField;
  int i;
  const_iterator it;
  vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *in_stack_ffffffffffffff18;
  ostream *in_stack_ffffffffffffff20;
  string local_58 [32];
  Field *local_38;
  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
  local_30;
  Option *local_28;
  int local_1c;
  Option *local_18;
  __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
  local_10 [2];
  
  local_18 = (Option *)
             std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::begin
                       ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                        in_stack_ffffffffffffff18);
  __gnu_cxx::
  __normal_iterator<MetaCommand::Option_const*,std::vector<MetaCommand::Option,std::allocator<MetaCommand::Option>>>
  ::__normal_iterator<MetaCommand::Option*>
            ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
              *)in_stack_ffffffffffffff20,
             (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
              *)in_stack_ffffffffffffff18);
  local_1c = 0;
  while( true ) {
    local_28 = (Option *)
               std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::end
                         ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                          in_stack_ffffffffffffff18);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                        *)in_stack_ffffffffffffff20,
                       (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                        *)in_stack_ffffffffffffff18);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"<option>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"<number>");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
    poVar2 = std::operator<<(poVar2,"</number>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"<name>");
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator*(local_10);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"</name>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"<tag>");
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator*(local_10);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    poVar4 = std::operator<<(poVar2,pcVar3);
    poVar4 = std::operator<<(poVar4,"</tag>");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_00 = (MetaCommand *)std::operator<<((ostream *)&std::cout,"<description>");
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator*(local_10);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    poVar4 = std::operator<<((ostream *)this_00,pcVar3);
    poVar4 = std::operator<<(poVar4,"</description>");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"<required>");
    pOVar5 = __gnu_cxx::
             __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
             ::operator*(local_10);
    if ((pOVar5->required & 1U) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"0</required>");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"1</required>");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"<nvalues>");
    pOVar5 = __gnu_cxx::
             __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
             ::operator*(local_10);
    sVar6 = std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::size
                      (&pOVar5->fields);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar6);
    poVar4 = std::operator<<(poVar4,"</nvalues>");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator*(local_10);
    local_30._M_current =
         (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::begin
                            (in_stack_ffffffffffffff18);
    while( true ) {
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
      ::operator*(local_10);
      local_38 = (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::end
                                    (in_stack_ffffffffffffff18);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                          *)in_stack_ffffffffffffff20,
                         (__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                          *)in_stack_ffffffffffffff18);
      if (!bVar1) break;
      poVar4 = std::operator<<((ostream *)&std::cout,"<field>");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"<name>");
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
      ::operator*(&local_30);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4,"</name>");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"<description>");
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
      ::operator*(&local_30);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4,"</description>");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"<type>");
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
      ::operator*(&local_30);
      TypeToString_abi_cxx11_(this_00,(TypeEnumType)((ulong)poVar2 >> 0x20));
      pcVar3 = (char *)std::__cxx11::string::c_str();
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4,"</type>");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_58);
      in_stack_ffffffffffffff20 = std::operator<<((ostream *)&std::cout,"<value>");
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
      ::operator*(&local_30);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      poVar4 = std::operator<<(in_stack_ffffffffffffff20,pcVar3);
      poVar4 = std::operator<<(poVar4,"</value>");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cout,"<external>");
      pFVar7 = __gnu_cxx::
               __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
               ::operator*(&local_30);
      if (pFVar7->externaldata == DATA_NONE) {
        poVar4 = std::operator<<((ostream *)&std::cout,"0</external>");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,"1</external>");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      std::operator<<((ostream *)&std::cout,"<required>");
      pFVar7 = __gnu_cxx::
               __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
               ::operator*(&local_30);
      if ((pFVar7->required & 1U) == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"0</required>");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,"1</required>");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"</field>");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
      ::operator++(&local_30);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"</option>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1c = local_1c + 1;
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator++(local_10);
  }
  return;
}

Assistant:

void MetaCommand::ListOptionsXML()
{
  OptionVector::const_iterator it = m_OptionVector.begin();
  int i=0;
  while(it != m_OptionVector.end())
    {
    METAIO_STREAM::cout << "<option>" << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "<number>" << i << "</number>" << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "<name>" << (*it).name.c_str() << "</name>" << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "<tag>" << (*it).tag.c_str() << "</tag>" << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "<description>" << (*it).description.c_str()
                                 << "</description>" << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "<required>";
    if((*it).required)
      {
      METAIO_STREAM::cout << "1</required>" << METAIO_STREAM::endl;
      }
    else
      {
      METAIO_STREAM::cout << "0</required>" << METAIO_STREAM::endl;
      }

    METAIO_STREAM::cout << "<nvalues>" << (*it).fields.size() << "</nvalues>" << METAIO_STREAM::endl;

    auto itField = (*it).fields.begin();
    while(itField != (*it).fields.end())
      {
      METAIO_STREAM::cout << "<field>" << METAIO_STREAM::endl;
      METAIO_STREAM::cout << "<name>" << (*itField).name.c_str() << "</name>" << METAIO_STREAM::endl;
      METAIO_STREAM::cout << "<description>" << (*itField).description.c_str()
                                   << "</description>" << METAIO_STREAM::endl;
      METAIO_STREAM::cout << "<type>" << this->TypeToString((*itField).type).c_str()
                            << "</type>" << METAIO_STREAM::endl;
      METAIO_STREAM::cout << "<value>" << (*itField).value.c_str() << "</value>"
                             << METAIO_STREAM::endl;
      METAIO_STREAM::cout << "<external>";
      if((*itField).externaldata)
        {
        METAIO_STREAM::cout << "1</external>" << METAIO_STREAM::endl;
        }
      else
        {
        METAIO_STREAM::cout << "0</external>" << METAIO_STREAM::endl;
        }
      METAIO_STREAM::cout << "<required>";
      if((*itField).required)
        {
        METAIO_STREAM::cout << "1</required>" << METAIO_STREAM::endl;
        }
      else
        {
        METAIO_STREAM::cout << "0</required>" << METAIO_STREAM::endl;
        }


      METAIO_STREAM::cout << "</field>" << METAIO_STREAM::endl;
      ++itField;
      }
    METAIO_STREAM::cout << "</option>" << METAIO_STREAM::endl;
    ++i;
    ++it;
    }
}